

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

optional<pbrt::ShapeSample> * __thiscall
pbrt::Sphere::Sample(optional<pbrt::ShapeSample> *__return_storage_ptr__,Sphere *this,Point2f *u)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  Transform *this_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  type tVar6;
  float fVar7;
  float fVar11;
  float fVar13;
  undefined1 auVar8 [16];
  undefined1 auVar12 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar14 [16];
  undefined1 auVar16 [12];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  Vector3f VVar18;
  Normal3<float> NVar19;
  Tuple3<pbrt::Vector3,_float> local_88;
  undefined1 local_78 [16];
  Point3fi local_60;
  Tuple3<pbrt::Normal3,_float> local_48;
  Tuple3<pbrt::Point3,_float> local_38;
  
  fVar7 = this->radius;
  fVar11 = fVar7;
  fVar13 = fVar7;
  VVar18 = SampleUniformSphere(u);
  auVar8._0_4_ = fVar7 * VVar18.super_Tuple3<pbrt::Vector3,_float>.x + 0.0;
  auVar8._4_4_ = fVar7 * VVar18.super_Tuple3<pbrt::Vector3,_float>.y + 0.0;
  auVar8._8_4_ = fVar7 * fVar11 + 0.0;
  auVar8._12_4_ = fVar7 * fVar13 + 0.0;
  local_38.z = fVar7 * VVar18.super_Tuple3<pbrt::Vector3,_float>.z + 0.0;
  local_38._0_8_ = vmovlps_avx(auVar8);
  fVar7 = this->radius;
  local_60.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x
  .low = 0.0;
  local_60.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x
  .high = 0.0;
  local_60.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
  .low = 0.0;
  tVar6 = Distance<float>((Point3<float> *)&local_38,(Point3<float> *)&local_60);
  fVar7 = fVar7 / tVar6;
  auVar14._0_4_ = local_38.x * fVar7;
  auVar14._4_4_ = local_38.y * fVar7;
  auVar14._8_4_ = fVar7 * 0.0;
  auVar14._12_4_ = fVar7 * 0.0;
  auVar16 = auVar14._4_12_;
  auVar17._8_4_ = 0x7fffffff;
  auVar17._0_8_ = 0x7fffffff7fffffff;
  auVar17._12_4_ = 0x7fffffff;
  local_38._0_8_ = vmovlps_avx(auVar14);
  local_48.z = fVar7 * local_38.z;
  auVar12 = (undefined1  [56])0x0;
  auVar8 = vandps_avx(ZEXT416((uint)local_48.z),auVar17);
  auVar5 = vandps_avx(auVar14,auVar17);
  auVar4._8_4_ = 0x34a00003;
  auVar4._0_8_ = 0x34a0000334a00003;
  auVar4._12_4_ = 0x34a00003;
  auVar5 = vmulps_avx512vl(auVar5,auVar4);
  local_88.z = auVar8._0_4_ * 2.980233e-07;
  local_88._0_8_ = vmovlps_avx(auVar5);
  local_48._0_8_ = vmovlps_avx(auVar14);
  local_38.z = local_48.z;
  NVar19 = Transform::operator()(this->renderFromObject,(Normal3<float> *)&local_48);
  local_60.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
  .low = NVar19.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar9._0_8_ = NVar19.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar9._8_56_ = auVar12;
  local_60.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x
       = (Interval<float>)vmovlps_avx(auVar9._0_16_);
  NVar19 = Normalize<float>((Normal3<float> *)&local_60);
  auVar10._0_8_ = NVar19.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar10._8_56_ = auVar12;
  auVar5 = auVar10._0_16_;
  bVar3 = this->reverseOrientation;
  if (bVar3 != false) {
    auVar5._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
    auVar5._8_4_ = auVar12._0_4_ ^ 0x80000000;
    auVar5._12_4_ = auVar12._4_4_ ^ 0x80000000;
  }
  this_00 = this->renderFromObject;
  local_78._0_4_ =
       (uint)(bVar3 & 1) * (int)-NVar19.super_Tuple3<pbrt::Normal3,_float>.z +
       (uint)!(bool)(bVar3 & 1) * (int)NVar19.super_Tuple3<pbrt::Normal3,_float>.z;
  local_78._4_12_ = auVar16;
  Point3fi::Point3fi(&local_60,(Point3f *)&local_38,(Vector3f *)&local_88);
  Transform::operator()((Point3fi *)__return_storage_ptr__,this_00,&local_60);
  fVar7 = this->zMax;
  fVar11 = this->phiMax;
  fVar13 = this->radius;
  fVar1 = this->zMin;
  __return_storage_ptr__->set = true;
  auVar15._0_12_ = ZEXT812(0);
  auVar15._12_4_ = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar15;
  uVar2 = vmovlps_avx(auVar5);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar2;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = local_78._0_4_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar15;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) =
       1.0 / (fVar11 * fVar13 * (fVar7 - fVar1));
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeSample> Sphere::Sample(const Point2f &u) const {
    Point3f pObj = Point3f(0, 0, 0) + radius * SampleUniformSphere(u);
    // Reproject _pObj_ to sphere surface and compute _pObjError_
    pObj *= radius / Distance(pObj, Point3f(0, 0, 0));
    Vector3f pObjError = gamma(5) * Abs((Vector3f)pObj);

    // Compute surface normal for sphere sample and return _ShapeSample_
    Normal3f n = Normalize((*renderFromObject)(Normal3f(pObj.x, pObj.y, pObj.z)));
    if (reverseOrientation)
        n *= -1;
    Point3fi pi = (*renderFromObject)(Point3fi(pObj, pObjError));
    return ShapeSample{Interaction(pi, n), 1 / Area()};
}